

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

ctl_arena_t * arenas_i(size_t i)

{
  tsd_t *tsd;
  ctl_arena_t *pcVar1;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_027eeb58);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  pcVar1 = arenas_i_impl(tsd,i,true,false);
  return pcVar1;
}

Assistant:

static ctl_arena_t *
arenas_i(size_t i) {
	ctl_arena_t *ret = arenas_i_impl(tsd_fetch(), i, true, false);
	assert(ret != NULL);
	return ret;
}